

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O3

void __thiscall helics::apps::Echo::processArgs(Echo *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  helicsCLI11App app;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  helicsCLI11App local_3c0;
  
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e0,"Options specific to the Echo App","");
  paVar1 = &local_460.field_2;
  local_460._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
  helicsCLI11App::helicsCLI11App(&local_3c0,&local_3e0,&local_460);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != paVar1) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"--delay","");
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_420,"the delay with which the echo app will echo message","");
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (&local_3c0.super_App,&local_400,&this->delayTime,&local_420);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((this->super_App).deactivated == false) {
    if (local_3c0.super_App.parsed_ != 0) {
      CLI::App::clear(&local_3c0.super_App);
    }
    local_3c0.super_App.parsed_ = 1;
    CLI::App::_validate(&local_3c0.super_App);
    CLI::App::_configure(&local_3c0.super_App);
    local_3c0.super_App.parent_ = (App *)0x0;
    local_3c0.super_App.parsed_ = 0;
    CLI::App::_parse(&local_3c0.super_App,&(this->super_App).remArgs);
    CLI::App::run_callback(&local_3c0.super_App,false,false);
  }
  else if ((this->super_App).helpMode == true) {
    helicsCLI11App::remove_helics_specifics(&local_3c0);
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"");
    CLI::App::help(&local_460,&local_3c0.super_App,&local_440,Normal);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_460._M_dataplus._M_p,local_460._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar1) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
  }
  local_3c0.super_App._vptr_App = (_func_int **)&PTR__helicsCLI11App_00511288;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3c0.remArgs);
  CLI::std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&local_3c0.cbacks);
  CLI::App::~App(&local_3c0.super_App);
  return;
}

Assistant:

void Echo::processArgs()
    {
        helicsCLI11App app("Options specific to the Echo App");
        app.add_option("--delay", delayTime, "the delay with which the echo app will echo message");
        if (!deactivated) {
            app.parse(remArgs);
        } else if (helpMode) {
            app.remove_helics_specifics();
            std::cout << app.help();
        }
    }